

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O1

void __thiscall
flatbuffers::go::GoGenerator::GetScalarFieldOfTable
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string getter;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  string local_50;
  
  GenGetter_abi_cxx11_(&local_50,this,&(field->value).type);
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[6])(&local_b0,&this->namer_,field);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x376aab);
  paVar1 = &local_d0.field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_d0.field_2._M_allocated_capacity = *psVar3;
    local_d0.field_2._8_8_ = plVar2[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar3;
    local_d0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_d0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  TypeName_abi_cxx11_(&local_90,this,field);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x37528d);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_d0.field_2._M_allocated_capacity = *psVar3;
    local_d0.field_2._8_8_ = plVar2[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar3;
    local_d0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_d0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  OffsetPrefix_abi_cxx11_(&local_d0,this,field);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  CastToEnum(&local_d0,this,&(field->value).type,&local_70);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    std::__cxx11::string::append((char *)code_ptr);
  }
  std::__cxx11::string::append((char *)code_ptr);
  GenConstant_abi_cxx11_(&local_90,this,field);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x37530a);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_d0.field_2._M_allocated_capacity = *psVar3;
    local_d0.field_2._8_8_ = plVar2[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar3;
    local_d0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_d0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GetScalarFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                             std::string *code_ptr) {
    std::string &code = *code_ptr;
    std::string getter = GenGetter(field.value.type);
    GenReceiver(struct_def, code_ptr);
    code += " " + namer_.Function(field);
    code += "() " + TypeName(field) + " ";
    code += OffsetPrefix(field);
    if (field.IsScalarOptional()) {
      code += "\t\tv := ";
    } else {
      code += "\t\treturn ";
    }
    code += CastToEnum(field.value.type, getter + "(o + rcv._tab.Pos)");
    if (field.IsScalarOptional()) { code += "\n\t\treturn &v"; }
    code += "\n\t}\n";
    code += "\treturn " + GenConstant(field) + "\n";
    code += "}\n\n";
  }